

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequential_normal_attribute_decoder.cc
# Opt level: O3

bool __thiscall
draco::SequentialNormalAttributeDecoder::DecodeDataNeededByPortableTransform
          (SequentialNormalAttributeDecoder *this,
          vector<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>,_std::allocator<draco::IndexType<unsigned_int,_draco::PointIndex_tag_type_>_>_>
          *point_ids,DecoderBuffer *in_buffer)

{
  bool bVar1;
  PointAttribute *attribute;
  
  if (1 < ((this->super_SequentialIntegerAttributeDecoder).super_SequentialAttributeDecoder.decoder_
          )->version_major_) {
    attribute = SequentialAttributeDecoder::GetPortableAttribute((SequentialAttributeDecoder *)this)
    ;
    bVar1 = AttributeOctahedronTransform::DecodeParameters
                      (&this->octahedral_transform_,attribute,in_buffer);
    if (!bVar1) {
      return false;
    }
  }
  bVar1 = AttributeTransform::TransferToAttribute
                    (&(this->octahedral_transform_).super_AttributeTransform,
                     (this->super_SequentialIntegerAttributeDecoder).
                     super_SequentialAttributeDecoder.portable_attribute_._M_t.
                     super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_draco::PointAttribute_*,_std::default_delete<draco::PointAttribute>_>
                     .super__Head_base<0UL,_draco::PointAttribute_*,_false>._M_head_impl);
  return bVar1;
}

Assistant:

bool SequentialNormalAttributeDecoder::DecodeDataNeededByPortableTransform(
    const std::vector<PointIndex> &point_ids, DecoderBuffer *in_buffer) {
  if (decoder()->bitstream_version() >= DRACO_BITSTREAM_VERSION(2, 0)) {
    // For newer file version, decode attribute transform data here.
    if (!octahedral_transform_.DecodeParameters(*GetPortableAttribute(),
                                                in_buffer)) {
      return false;
    }
  }

  // Store the decoded transform data in portable attribute.
  return octahedral_transform_.TransferToAttribute(portable_attribute());
}